

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CSynchWaitController::ReleaseWaitingThreadWithoutBlocking(CSynchWaitController *this)

{
  PAL_ERROR PVar1;
  CPalThread *pCVar2;
  CPalThread *pthrCurrent;
  
  pCVar2 = InternalGetCurrentThread();
  pthrCurrent = (this->super_CSynchControllerBase).m_pthrOwner;
  if (pCVar2 != pthrCurrent) {
    fprintf(_stderr,"] %s %s:%d","ReleaseWaitingThreadWithoutBlocking",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0xef);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == m_pthrOwner\n");
    pthrCurrent = (this->super_CSynchControllerBase).m_pthrOwner;
  }
  PVar1 = CSynchData::ReleaseWaiterWithoutBlocking
                    ((this->super_CSynchControllerBase).m_psdSynchData,pthrCurrent,pthrCurrent);
  return PVar1;
}

Assistant:

PAL_ERROR CSynchWaitController::ReleaseWaitingThreadWithoutBlocking()
    {
        VALIDATEOBJECT(m_psdSynchData);

        PAL_ERROR palErr = NO_ERROR;        

        _ASSERTE(InternalGetCurrentThread() == m_pthrOwner);

        palErr = m_psdSynchData->ReleaseWaiterWithoutBlocking(m_pthrOwner, m_pthrOwner);

#ifdef SYNCH_STATISTICS
        if (NO_ERROR == palErr)
        {
            m_psdSynchData->IncrementStatWaitCount();
        }
#endif
        return palErr;
    }